

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_field_half(void)

{
  int iVar1;
  int iVar2;
  int m;
  secp256k1_fe *unaff_retaddr;
  secp256k1_fe u;
  secp256k1_fe t;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  secp256k1_fe *in_stack_ffffffffffffffa0;
  int local_38;
  int local_34;
  ulong local_30 [5];
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  secp256k1_fe_get_bounds(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  secp256k1_fe_half((secp256k1_fe *)0x11854a);
  if (in_stack_fffffffffffffff8 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0xb87,"test condition failed: t.magnitude == 1");
    abort();
  }
  if (in_stack_fffffffffffffffc != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0xb88,"test condition failed: t.normalized == 0");
    abort();
  }
  iVar1 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)0x1185ee);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0xb8a,"test condition failed: secp256k1_fe_normalizes_to_zero(&t)");
    abort();
  }
  iVar1 = 1;
  while( true ) {
    if (0x1f < iVar1) {
      return;
    }
    secp256k1_fe_get_bounds(in_stack_ffffffffffffffa0,iVar1);
    memcpy(&stack0xffffffffffffffa0,local_30,0x30);
    secp256k1_fe_half((secp256k1_fe *)0x118676);
    if (local_38 != (iVar1 >> 1) + 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0xb94,"test condition failed: u.magnitude == (m >> 1) + 1");
      abort();
    }
    if (local_34 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0xb95,"test condition failed: u.normalized == 0");
      abort();
    }
    secp256k1_fe_normalize_weak((secp256k1_fe *)0x118722);
    secp256k1_fe_add(in_stack_ffffffffffffffa0,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_ffffffffffffff98));
    iVar2 = fe_equal(unaff_retaddr,
                     (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0xb99,"test condition failed: fe_equal(&t, &u)");
      abort();
    }
    secp256k1_fe_get_bounds(in_stack_ffffffffffffffa0,iVar1);
    if (local_30[0] == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0xba0,"test condition failed: t.n[0] > 0");
      abort();
    }
    if ((local_30[0] & 1) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0xba1,"test condition failed: (t.n[0] & 1) == 0");
      abort();
    }
    local_30[0] = local_30[0] - 1;
    memcpy(&stack0xffffffffffffffa0,local_30,0x30);
    secp256k1_fe_half((secp256k1_fe *)0x118862);
    if (local_38 != (iVar1 >> 1) + 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0xba7,"test condition failed: u.magnitude == (m >> 1) + 1");
      abort();
    }
    secp256k1_fe_normalize_weak((secp256k1_fe *)0x11890e);
    secp256k1_fe_add(in_stack_ffffffffffffffa0,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_ffffffffffffff98));
    iVar2 = fe_equal(unaff_retaddr,
                     (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (iVar2 == 0) break;
    iVar1 = iVar1 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c",
          0xbac,"test condition failed: fe_equal(&t, &u)");
  abort();
}

Assistant:

static void run_field_half(void) {
    secp256k1_fe t, u;
    int m;

    /* Check magnitude 0 input */
    secp256k1_fe_get_bounds(&t, 0);
    secp256k1_fe_half(&t);
#ifdef VERIFY
    CHECK(t.magnitude == 1);
    CHECK(t.normalized == 0);
#endif
    CHECK(secp256k1_fe_normalizes_to_zero(&t));

    /* Check non-zero magnitudes in the supported range */
    for (m = 1; m < 32; m++) {
        /* Check max-value input */
        secp256k1_fe_get_bounds(&t, m);

        u = t;
        secp256k1_fe_half(&u);
#ifdef VERIFY
        CHECK(u.magnitude == (m >> 1) + 1);
        CHECK(u.normalized == 0);
#endif
        secp256k1_fe_normalize_weak(&u);
        secp256k1_fe_add(&u, &u);
        CHECK(fe_equal(&t, &u));

        /* Check worst-case input: ensure the LSB is 1 so that P will be added,
         * which will also cause all carries to be 1, since all limbs that can
         * generate a carry are initially even and all limbs of P are odd in
         * every existing field implementation. */
        secp256k1_fe_get_bounds(&t, m);
        CHECK(t.n[0] > 0);
        CHECK((t.n[0] & 1) == 0);
        --t.n[0];

        u = t;
        secp256k1_fe_half(&u);
#ifdef VERIFY
        CHECK(u.magnitude == (m >> 1) + 1);
        CHECK(u.normalized == 0);
#endif
        secp256k1_fe_normalize_weak(&u);
        secp256k1_fe_add(&u, &u);
        CHECK(fe_equal(&t, &u));
    }
}